

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O1

void test_interpolation_1(void)

{
  run("mustache-free templates should render as-is","Hello from {Mustache}!\n","{}",(char *)0x0,
      "Hello from {Mustache}!\n");
  return;
}

Assistant:

static void
test_interpolation_1(void)
{
    run(
        "mustache-free templates should render as-is",
        "Hello from {Mustache}!\n",
        "{}",
        NULL,
        "Hello from {Mustache}!\n"
    );
}